

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall
CConnman::AddConnection
          (CConnman *this,string *address,ConnectionType conn_type,bool use_v2transport)

{
  long lVar1;
  bool bVar2;
  __optional_ge_t<int,_int> _Var3;
  byte bVar4;
  CAddress *this_00;
  byte in_CL;
  uint in_EDX;
  long in_FS_OFFSET;
  int existing_connections;
  CSemaphoreGrant grant;
  optional<int> max_connections;
  uint in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  CSemaphore *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 in_stack_ffffffffffffff9b;
  ConnectionType in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  CAddress *in_stack_ffffffffffffffa8;
  undefined7 local_50;
  undefined1 in_stack_ffffffffffffffb7;
  CAddress *in_stack_ffffffffffffffb8;
  CConnman *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(Mutex *)0x20ef9b);
  std::optional<int>::optional
            ((optional<int> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  this_00 = (CAddress *)(ulong)in_EDX;
  switch(this_00) {
  case (CAddress *)0x0:
  case (CAddress *)0x2:
    bVar4 = 0;
    goto LAB_0020f190;
  case (CAddress *)0x1:
    std::optional<int>::optional<int_&,_true>
              ((optional<int> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (int *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffffb8 = (CAddress *)CONCAT17(in_stack_ffffffffffffffb7,local_50);
    break;
  case (CAddress *)0x3:
    break;
  case (CAddress *)0x4:
    std::optional<int>::optional<int_&,_true>
              ((optional<int> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (int *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffa8;
    break;
  case (CAddress *)0x5:
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  AddConnection::anon_class_16_2_4298c8da::operator()
            ((anon_class_16_2_4298c8da *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar2 = std::operator==(&stack0xffffffffffffffb8);
  if ((((bVar2 ^ 0xffU) & 1) == 0) ||
     (_Var3 = std::operator>=((int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                              (optional<int> *)in_stack_ffffffffffffff30), !_Var3)) {
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator*
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    CSemaphoreGrant::CSemaphoreGrant
              ((CSemaphoreGrant *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
    bVar4 = CSemaphoreGrant::operator_cast_to_bool
                      ((CSemaphoreGrant *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if ((bool)bVar4) {
      CAddress::CAddress(this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff28 = (uint)(in_CL & 1);
      OpenNetworkConnection
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7
                 ,(CSemaphoreGrant *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,(bool)in_stack_ffffffffffffff9b);
      CAddress::~CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
    }
    CSemaphoreGrant::~CSemaphoreGrant
              ((CSemaphoreGrant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  else {
    bVar4 = 0;
  }
LAB_0020f190:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool CConnman::AddConnection(const std::string& address, ConnectionType conn_type, bool use_v2transport = false)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::optional<int> max_connections;
    switch (conn_type) {
    case ConnectionType::INBOUND:
    case ConnectionType::MANUAL:
        return false;
    case ConnectionType::OUTBOUND_FULL_RELAY:
        max_connections = m_max_outbound_full_relay;
        break;
    case ConnectionType::BLOCK_RELAY:
        max_connections = m_max_outbound_block_relay;
        break;
    // no limit for ADDR_FETCH because -seednode has no limit either
    case ConnectionType::ADDR_FETCH:
        break;
    // no limit for FEELER connections since they're short-lived
    case ConnectionType::FEELER:
        break;
    } // no default case, so the compiler can warn about missing cases

    // Count existing connections
    int existing_connections = WITH_LOCK(m_nodes_mutex,
                                         return std::count_if(m_nodes.begin(), m_nodes.end(), [conn_type](CNode* node) { return node->m_conn_type == conn_type; }););

    // Max connections of specified type already exist
    if (max_connections != std::nullopt && existing_connections >= max_connections) return false;

    // Max total outbound connections already exist
    CSemaphoreGrant grant(*semOutbound, true);
    if (!grant) return false;

    OpenNetworkConnection(CAddress(), false, std::move(grant), address.c_str(), conn_type, /*use_v2transport=*/use_v2transport);
    return true;
}